

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<SubArray,_Macro>_>::freeData
          (Span<QHashPrivate::Node<SubArray,_Macro>_> *this)

{
  uchar *puVar1;
  Entry *pEVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->entries != (Entry *)0x0) {
    lVar5 = 0;
    do {
      if (this->offsets[lVar5] != 0xff) {
        pEVar2 = this->entries;
        uVar4 = (ulong)((uint)this->offsets[lVar5] * 0x60);
        QArrayDataPointer<Symbol>::~QArrayDataPointer
                  ((QArrayDataPointer<Symbol> *)((pEVar2->storage).data + uVar4 + 0x48));
        puVar1 = (pEVar2->storage).data + uVar4;
        QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)(puVar1 + 0x30));
        piVar3 = *(int **)puVar1;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)((pEVar2->storage).data + uVar4),1,0x10);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }